

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O3

void __thiscall gimage::TIFFImageIO::save(TIFFImageIO *this,ImageFloat *image,char *name)

{
  long lVar1;
  float ***pppfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  int iVar8;
  long lVar9;
  IOException *pIVar10;
  long lVar11;
  pointer pfVar12;
  long lVar13;
  ulong uVar14;
  vector<float,_std::allocator<float>_> line;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  vector<float,_std::allocator<float>_> local_40;
  
  lVar9 = TIFFOpen(name,"w");
  if (lVar9 == 0) {
    pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_80,name,(allocator *)&local_40);
    std::operator+(&local_60,"Cannot store image: ",&local_80);
    gutil::IOException::IOException(pIVar10,&local_60);
    __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  TIFFSetField(lVar9,0x100,(int)image->width);
  TIFFSetField(lVar9,0x101,(int)image->height);
  TIFFSetField(lVar9,0x115,(short)image->depth);
  TIFFSetField(lVar9,0x102,0x20);
  TIFFSetField(lVar9,0x153,3);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)image->depth * image->width * 4;
  auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x2000);
  uVar6 = SUB164(auVar4 / auVar3,0);
  if (uVar6 < 2) {
    uVar6 = 1;
  }
  uVar5 = (uint)image->height;
  if ((int)uVar6 < (int)uVar5) {
    uVar5 = uVar6;
  }
  uVar7 = TIFFDefaultStripSize(lVar9,uVar5,SUB168(auVar4 % auVar3,0));
  TIFFSetField(lVar9,0x116,uVar7);
  TIFFSetField(lVar9,0x112,1);
  TIFFSetField(lVar9,0x11c,1);
  TIFFSetField(lVar9,0x106,(image->depth - 3U < 2) + '\x01');
  if ((long)image->depth == 1) {
    if (0 < image->height) {
      uVar14 = 0;
      do {
        iVar8 = TIFFWriteScanline(lVar9,(*image->img)[uVar14],uVar14 & 0xffffffff,0);
        if (iVar8 < 0) {
          TIFFClose(lVar9);
          pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string((string *)&local_80,name,(allocator *)&local_40);
          std::operator+(&local_60,"Cannot write image data: ",&local_80);
          gutil::IOException::IOException(pIVar10,&local_60);
          __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < image->height);
    }
  }
  else {
    std::vector<float,_std::allocator<float>_>::vector
              (&local_40,(long)image->depth * image->width,(allocator_type *)&local_60);
    if (0 < image->height) {
      uVar14 = 0;
      do {
        lVar1 = image->width;
        if (0 < lVar1) {
          uVar6 = image->depth;
          pppfVar2 = image->img;
          lVar11 = 0;
          pfVar12 = local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            if (0 < (int)uVar6) {
              lVar13 = 0;
              do {
                *(undefined4 *)((long)pfVar12 + lVar13) =
                     *(undefined4 *)
                      (*(long *)(*(long *)((long)pppfVar2 + lVar13 * 2) + uVar14 * 8) + lVar11 * 4);
                lVar13 = lVar13 + 4;
              } while ((ulong)uVar6 << 2 != lVar13);
              pfVar12 = (pointer)((long)pfVar12 + lVar13);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != lVar1);
        }
        iVar8 = TIFFWriteScanline(lVar9,local_40.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start,uVar14 & 0xffffffff
                                  ,0);
        if (iVar8 < 0) {
          TIFFClose(lVar9);
          pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string((string *)&local_80,name,&local_81);
          std::operator+(&local_60,"Cannot write image data: ",&local_80);
          gutil::IOException::IOException(pIVar10,&local_60);
          __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < image->height);
    }
    if (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  TIFFClose(lVar9);
  return;
}

Assistant:

void TIFFImageIO::save(const ImageFloat &image, const char *name) const
{
  saveInternal(image, name);
}